

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

void __thiscall FString::FString(FString *this,char head,FString *tail)

{
  char *pcVar1;
  ulong __n;
  
  AllocBuffer(this,(ulong)*(uint *)(tail->Chars + -0xc) + 1);
  *this->Chars = head;
  pcVar1 = this->Chars;
  __n = (ulong)*(uint *)(tail->Chars + -0xc);
  memcpy(pcVar1 + 1,tail->Chars,__n);
  pcVar1[__n + 1] = '\0';
  return;
}

Assistant:

FString::FString (char head, const FString &tail)
{
	size_t len2 = tail.Len();
	AllocBuffer (1 + len2);
	Chars[0] = head;
	StrCopy (Chars + 1, tail);
}